

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::CharReaderBuilder::validate(CharReaderBuilder *this,Value *invalid)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  Value *other;
  Value *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  long lVar4;
  const_iterator cVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_1c5;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1c4;
  allocator<char> local_1c3;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  allocator<char> local_1c0;
  allocator<char> local_1bf;
  allocator<char> local_1be;
  allocator<char> local_1bd;
  allocator<char> local_1bc;
  allocator<char> local_1bb;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  ValueIteratorBase local_1b8;
  String key;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  if ((validate(Json::Value*)::valid_keys_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&validate(Json::Value*)::valid_keys_abi_cxx11_), iVar2 != 0)) {
    this_01 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)operator_new(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&key,"collectComments",(allocator<char> *)&local_1b8);
    std::__cxx11::string::string<std::allocator<char>>(local_188,"allowComments",&local_1b9);
    std::__cxx11::string::string<std::allocator<char>>(local_168,"allowTrailingCommas",&local_1ba);
    std::__cxx11::string::string<std::allocator<char>>(local_148,"strictRoot",&local_1bb);
    std::__cxx11::string::string<std::allocator<char>>
              (local_128,"allowDroppedNullPlaceholders",&local_1bc);
    std::__cxx11::string::string<std::allocator<char>>(local_108,"allowNumericKeys",&local_1bd);
    std::__cxx11::string::string<std::allocator<char>>(local_e8,"allowSingleQuotes",&local_1be);
    std::__cxx11::string::string<std::allocator<char>>(local_c8,"stackLimit",&local_1bf);
    std::__cxx11::string::string<std::allocator<char>>(local_a8,"failIfExtra",&local_1c0);
    std::__cxx11::string::string<std::allocator<char>>(local_88,"rejectDupKeys",&local_1c1);
    std::__cxx11::string::string<std::allocator<char>>(local_68,"allowSpecialFloats",&local_1c2);
    std::__cxx11::string::string<std::allocator<char>>(local_48,"skipBom",&local_1c3);
    __l._M_len = 0xc;
    __l._M_array = &key;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(this_01,__l,&local_1c4,&local_1c5);
    lVar4 = 0x160;
    do {
      std::__cxx11::string::~string(local_188 + lVar4 + -0x20);
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    validate(Json::Value*)::valid_keys_abi_cxx11_ = this_01;
    __cxa_guard_release(&validate(Json::Value*)::valid_keys_abi_cxx11_);
  }
  cVar5 = Value::begin(&this->settings_);
  local_1b8.current_ = cVar5.super_ValueIteratorBase.current_._M_node;
  local_1b8.isNull_ = cVar5.super_ValueIteratorBase.isNull_;
  do {
    cVar5 = Value::end(&this->settings_);
    key._M_dataplus._M_p = (pointer)cVar5.super_ValueIteratorBase.current_._M_node;
    key._M_string_length._0_1_ = cVar5.super_ValueIteratorBase.isNull_;
    bVar1 = ValueIteratorBase::operator!=(&local_1b8,(SelfType *)&key);
    if (!bVar1) {
      if (invalid == (Value *)0x0) {
        bVar1 = true;
      }
      else {
        bVar1 = Value::empty(invalid);
      }
      return bVar1;
    }
    ValueIteratorBase::name_abi_cxx11_(&key,&local_1b8);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(validate(Json::Value*)::valid_keys_abi_cxx11_,&key);
    if (sVar3 == 0) {
      if (invalid == (Value *)0x0) {
        std::__cxx11::string::~string((string *)&key);
        return false;
      }
      other = ValueIteratorBase::deref(&local_1b8);
      this_00 = Value::operator[](invalid,&key);
      Value::operator=(this_00,other);
    }
    std::__cxx11::string::~string((string *)&key);
    ValueIteratorBase::increment(&local_1b8);
  } while( true );
}

Assistant:

bool CharReaderBuilder::validate(Json::Value* invalid) const {
  static const auto& valid_keys = *new std::set<String>{
      "collectComments",
      "allowComments",
      "allowTrailingCommas",
      "strictRoot",
      "allowDroppedNullPlaceholders",
      "allowNumericKeys",
      "allowSingleQuotes",
      "stackLimit",
      "failIfExtra",
      "rejectDupKeys",
      "allowSpecialFloats",
      "skipBom",
  };
  for (auto si = settings_.begin(); si != settings_.end(); ++si) {
    auto key = si.name();
    if (valid_keys.count(key))
      continue;
    if (invalid)
      (*invalid)[key] = *si;
    else
      return false;
  }
  return invalid ? invalid->empty() : true;
}